

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CheckerDataDeclarationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CheckerDataDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::syntax::DataDeclarationSyntax&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,DataDeclarationSyntax *args_2)

{
  Token rand;
  CheckerDataDeclarationSyntax *pCVar1;
  CheckerDataDeclarationSyntax *in_RCX;
  BumpAllocator *in_RDX;
  Info *in_RSI;
  size_t in_stack_ffffffffffffffd8;
  
  pCVar1 = (CheckerDataDeclarationSyntax *)allocate(in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8)
  ;
  rand.info = in_RSI;
  rand._0_8_ = in_RDX;
  slang::syntax::CheckerDataDeclarationSyntax::CheckerDataDeclarationSyntax
            (in_RCX,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)in_RDX->endPtr,rand,
             (DataDeclarationSyntax *)in_RDX->head);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }